

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float16_to_float64_aarch64(float16 a,_Bool ieee,float_status *s)

{
  FloatFmt *parm;
  undefined7 in_register_00000031;
  FloatParts FVar1;
  
  parm = &float16_params_ahp;
  if ((int)CONCAT71(in_register_00000031,ieee) != 0) {
    parm = &float16_params;
  }
  FVar1._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar1.frac = (ulong)(a & 0x3ff);
  FVar1 = sf_canonicalize(FVar1,parm,s);
  FVar1 = float_to_float(FVar1,&float64_params,s);
  FVar1 = round_canonical(FVar1,s,&float64_params);
  return FVar1.frac & 0xfffffffffffff | (ulong)(FVar1.exp & 0x7ff) << 0x34 |
         (FVar1._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

float64 float16_to_float64(float16 a, bool ieee, float_status *s)
{
    const FloatFmt *fmt16 = ieee ? &float16_params : &float16_params_ahp;
    FloatParts p = float16a_unpack_canonical(a, s, fmt16);
    FloatParts pr = float_to_float(p, &float64_params, s);
    return float64_round_pack_canonical(pr, s);
}